

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseArray(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  undefined4 extraout_var;
  Lexeme *pLVar2;
  SynBase *pSVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  IntrusiveList<SynBase> IVar4;
  IntrusiveList<SynBase> values;
  SynGenerator *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_ofigure) {
    ctx->currentLexeme = begin + 1;
    if (begin[1].type == lex_for) {
      IVar4 = ParseExpressions(ctx);
      anon_unknown.dwarf_147a9::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynGenerator *)CONCAT44(extraout_var,iVar1);
      pLVar2 = ParseContext::Previous(ctx);
      SynGenerator::SynGenerator(this,begin,pLVar2,IVar4);
    }
    else {
      if (0xff < ctx->expressionBlockDepth) {
        anon_unknown.dwarf_147a9::Stop
                  (ctx,begin + 1,"ERROR: reached nested array limit of %d",0x100);
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth + 1;
      values.head = (SynBase *)0x0;
      values.tail = (SynBase *)0x0;
      pSVar3 = ParseTernaryExpr(ctx);
      if (pSVar3 == (SynBase *)0x0) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: value not found after \'{\'");
        iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pSVar3 = (SynBase *)CONCAT44(extraout_var_00,iVar1);
        SynError::SynError((SynError *)pSVar3,ctx->currentLexeme,ctx->currentLexeme);
      }
      IntrusiveList<SynBase>::push_back(&values,pSVar3);
      while (ctx->currentLexeme->type == lex_comma) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        pSVar3 = ParseTernaryExpr(ctx);
        if (pSVar3 == (SynBase *)0x0) {
          anon_unknown.dwarf_147a9::Report
                    (ctx,ctx->currentLexeme,"ERROR: value not found after \',\'");
        }
        else {
          IntrusiveList<SynBase>::push_back(&values,pSVar3);
        }
      }
      ctx->expressionBlockDepth = ctx->expressionBlockDepth - 1;
      anon_unknown.dwarf_147a9::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after inline array");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynGenerator *)CONCAT44(extraout_var_01,iVar1);
      pLVar2 = ParseContext::Previous(ctx);
      IVar4.tail = values.tail;
      IVar4.head = values.head;
      SynArray::SynArray((SynArray *)this,begin,pLVar2,IVar4);
    }
  }
  else {
    this = (SynGenerator *)0x0;
  }
  return &this->super_SynBase;
}

Assistant:

SynBase* ParseArray(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_ofigure))
	{
		if(ctx.At(lex_for))
		{
			IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

			return new (ctx.get<SynGenerator>()) SynGenerator(start, ctx.Previous(), expressions);
		}

		const unsigned blockLimit = 256;

		if(ctx.expressionBlockDepth >= blockLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested array limit of %d", blockLimit);

		ctx.expressionBlockDepth++;

		IntrusiveList<SynBase> values;

		SynBase *value = ParseTernaryExpr(ctx);

		if(!value)
		{
			Report(ctx, ctx.Current(), "ERROR: value not found after '{'");

			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		values.push_back(value);

		while(ctx.Consume(lex_comma))
		{
			value = ParseTernaryExpr(ctx);

			if(!value)
				Report(ctx, ctx.Current(), "ERROR: value not found after ','");
			else
				values.push_back(value);
		}

		ctx.expressionBlockDepth--;

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after inline array");

		return new (ctx.get<SynArray>()) SynArray(start, ctx.Previous(), values);
	}

	return NULL;
}